

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_api.cpp
# Opt level: O1

void long_running_query(Connection *conn,bool *correct)

{
  bool bVar1;
  unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
  result;
  _Head_base<0UL,_duckdb::MaterializedQueryResult_*,_false> local_40;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  *correct = true;
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_38,
             "SELECT i1.i FROM integers i1, integers i2, integers i3, integers i4, integers i5, integers i6, integers i7, integers i8, integers i9, integers i10,integers i11, integers i12, integers i13"
             ,"");
  duckdb::Connection::Query((string *)&local_40);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0]);
  }
  duckdb::
  unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
  ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                *)&local_40);
  bVar1 = (bool)duckdb::BaseQueryResult::HasError();
  *correct = bVar1;
  if (local_40._M_head_impl != (MaterializedQueryResult *)0x0) {
    (**(code **)(*(long *)local_40._M_head_impl + 8))();
  }
  return;
}

Assistant:

static void long_running_query(Connection *conn, bool *correct) {
	*correct = true;
	auto result = conn->Query("SELECT i1.i FROM integers i1, integers i2, integers i3, integers i4, integers i5, "
	                          "integers i6, integers i7, integers i8, integers i9, integers i10,"
	                          "integers i11, integers i12, integers i13");
	// the query should fail
	*correct = result->HasError();
}